

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::cpu_support_arm_neon(void)

{
  try_initialize_global_cpu_info();
  return 0;
}

Assistant:

int cpu_support_arm_neon()
{
    try_initialize_global_cpu_info();
#if __aarch64__
    return 1;
#elif __arm__
#if defined _WIN32
    return g_cpu_support_arm_neon;
#elif defined __ANDROID__ || defined __linux__
    return g_hwcaps & HWCAP_NEON;
#elif __APPLE__
    return g_hw_cputype == CPU_TYPE_ARM && g_hw_cpusubtype > CPU_SUBTYPE_ARM_V7;
#else
    return 0;
#endif
#else
    return 0;
#endif
}